

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

void DumpClassMap(FClassMap *themap)

{
  uint uVar1;
  bool bVar2;
  hash_t hVar3;
  ulong uVar4;
  void *__base;
  char *pcVar5;
  int local_38;
  int local_34;
  int j;
  int i;
  Pair **allpairs;
  Pair *pair;
  Iterator it;
  FClassMap *themap_local;
  
  it._8_8_ = themap;
  TMapIterator<int,_PClassActor_*,_TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>_>
  ::TMapIterator((TMapIterator<int,_PClassActor_*,_TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>_>
                  *)&pair,themap);
  local_34 = 0;
  hVar3 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CountUsed
                    ((TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_> *)
                     it._8_8_);
  uVar4 = SUB168(ZEXT416(hVar3) * ZEXT816(8),0);
  if (SUB168(ZEXT416(hVar3) * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __base = operator_new__(uVar4);
  while( true ) {
    bVar2 = TMapIterator<int,_PClassActor_*,_TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>_>
            ::NextPair((TMapIterator<int,_PClassActor_*,_TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>_>
                        *)&pair,(Pair **)&allpairs);
    if (!bVar2) break;
    *(Pair ***)((long)__base + (long)local_34 * 8) = allpairs;
    local_34 = local_34 + 1;
  }
  qsort(__base,(long)local_34,8,SpawnableSort);
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    allpairs = *(Pair ***)((long)__base + (long)local_38 * 8);
    uVar1 = *(uint *)allpairs;
    pcVar5 = FName::GetChars((FName *)(allpairs[1] + 10));
    Printf("%d %s\n",(ulong)uVar1,pcVar5);
  }
  if (__base != (void *)0x0) {
    operator_delete__(__base);
  }
  return;
}

Assistant:

static void DumpClassMap(FClassMap &themap)
{
	FClassMap::Iterator it(themap);
	FClassMap::Pair *pair, **allpairs;
	int i = 0;

	// Sort into numerical order, since their arrangement in the map can
	// be in an unspecified order.
	allpairs = new FClassMap::Pair *[themap.CountUsed()];
	while (it.NextPair(pair))
	{
		allpairs[i++] = pair;
	}
	qsort(allpairs, i, sizeof(*allpairs), SpawnableSort);
	for (int j = 0; j < i; ++j)
	{
		pair = allpairs[j];
		Printf ("%d %s\n", pair->Key, pair->Value->TypeName.GetChars());
	}
	delete[] allpairs;
}